

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectivePosition(Parser *parser,int flags)

{
  CDirectivePosition *this;
  short in_DX;
  Type type;
  undefined4 in_register_00000034;
  Expression exp;
  Expression local_50;
  Expression local_38;
  
  Parser::parseExpression(&local_50,(Parser *)CONCAT44(in_register_00000034,flags));
  if (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
LAB_0017d308:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this = (CDirectivePosition *)0x0;
  }
  else {
    if (in_DX == 1) {
      type = Physical;
    }
    else {
      if (in_DX != 2) goto LAB_0017d308;
      type = Virtual;
    }
    this = (CDirectivePosition *)operator_new(0x48);
    local_38.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_38.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_38.constExpression = local_50.constExpression;
    CDirectivePosition::CDirectivePosition(this,&local_38,type);
    if (local_38.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.expression.
                 super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  if (local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.expression.
               super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectivePosition(Parser& parser, int flags)
{
	Expression exp = parser.parseExpression();
	if (!exp.isLoaded())
		return nullptr;

	CDirectivePosition::Type type;
	switch (flags & DIRECTIVE_USERMASK)
	{
	case DIRECTIVE_POS_PHYSICAL:
		type = CDirectivePosition::Physical;
		break;
	case DIRECTIVE_POS_VIRTUAL:
		type = CDirectivePosition::Virtual;
		break;
	default:
		return nullptr;
	}

	return std::make_unique<CDirectivePosition>(exp,type);
}